

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpnetworkreply_p.cpp
# Opt level: O1

void * __thiscall QHttpNetworkReply::qt_metacast(QHttpNetworkReply *this,char *_clname)

{
  int iVar1;
  void *pvVar2;
  
  if (_clname == (char *)0x0) {
    this = (QHttpNetworkReply *)0x0;
  }
  else {
    iVar1 = strcmp(_clname,qt_staticMetaObjectStaticContent<(anonymous_namespace)::qt_meta_tag_ZN17QHttpNetworkReplyE_t>
                           .strings);
    if (iVar1 != 0) {
      iVar1 = strcmp(_clname,"QHttpNetworkHeader");
      if (iVar1 != 0) {
        pvVar2 = (void *)QObject::qt_metacast((char *)this);
        return pvVar2;
      }
      this = this + 0x10;
    }
  }
  return this;
}

Assistant:

void *QHttpNetworkReply::qt_metacast(const char *_clname)
{
    if (!_clname) return nullptr;
    if (!strcmp(_clname, qt_staticMetaObjectStaticContent<qt_meta_tag_ZN17QHttpNetworkReplyE_t>.strings))
        return static_cast<void*>(this);
    if (!strcmp(_clname, "QHttpNetworkHeader"))
        return static_cast< QHttpNetworkHeader*>(this);
    return QObject::qt_metacast(_clname);
}